

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRefSelect.c
# Opt level: O1

void Rnm_ManPrintSelected(Rnm_Man_t *p,Vec_Int_t *vNewPPis)

{
  Gia_Man_t *pGVar1;
  undefined8 uVar2;
  Vec_Int_t *pVVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  pVVar3 = p->vMap;
  if (pVVar3->nSize < 1) {
    uVar4 = 0;
  }
  else {
    lVar7 = 0;
    uVar4 = 0;
    do {
      iVar6 = pVVar3->pArray[lVar7];
      if ((long)iVar6 < 0) {
LAB_00618715:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar1 = p->pGia;
      if (pGVar1->nObjs <= iVar6) goto LAB_00618715;
      if (pGVar1->pObjs == (Gia_Obj_t *)0x0) break;
      uVar2 = *(undefined8 *)(pGVar1->pObjs + iVar6);
      if (((~(uint)uVar2 & 0x9fffffff) == 0) &&
         ((int)((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff) < pGVar1->vCis->nSize - pGVar1->nRegs)) {
        iVar6 = 0x2d;
      }
      else {
        if (pGVar1->nObjs <= iVar6) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        if (0 < (long)vNewPPis->nSize) {
          lVar5 = 0;
          do {
            if (vNewPPis->pArray[lVar5] == iVar6) {
              putchar(0x31);
              uVar4 = uVar4 + 1;
              goto LAB_006186e3;
            }
            lVar5 = lVar5 + 1;
          } while (vNewPPis->nSize != lVar5);
        }
        iVar6 = 0x30;
      }
      putchar(iVar6);
LAB_006186e3:
      lVar7 = lVar7 + 1;
      pVVar3 = p->vMap;
    } while (lVar7 < pVVar3->nSize);
  }
  printf(" %3d\n",(ulong)uVar4);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START 

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Rnm_ManPrintSelected( Rnm_Man_t * p, Vec_Int_t * vNewPPis )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    Gia_ManForEachObjVec( p->vMap, p->pGia, pObj, i )
        if ( Gia_ObjIsPi(p->pGia, pObj) ) 
            printf( "-" );
        else if ( Vec_IntFind(vNewPPis, Gia_ObjId(p->pGia, pObj)) >= 0 )// this is PPI
            printf( "1" ), Counter++;
        else
            printf( "0" );
    printf( " %3d\n", Counter );
}